

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O1

int __thiscall
CVmObjFrameDesc::getp_get_targobj
          (CVmObjFrameDesc *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  
  if (getp_get_targobj(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_targobj();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_targobj::desc);
  if (iVar4 == 0) {
    uVar1 = *(uint *)(this->super_CVmObject).ext_;
    plVar2 = *(long **)((long)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 8);
    lVar3 = *plVar2;
    if (lVar3 == 0) {
      vVar5 = *(vm_obj_id_t *)((long)plVar2 + 0x3c);
    }
    else {
      vVar5 = 0;
      if (*(int *)(lVar3 + -0xa0) != 1) {
        vVar5 = *(vm_obj_id_t *)(lVar3 + -0x98);
      }
    }
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar5;
    if (vVar5 == 0) {
      retval->typ = VM_NIL;
    }
  }
  return 1;
}

Assistant:

int CVmObjFrameDesc::getp_get_targobj(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                      uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get 'targetobj' from the frame */
    get_frame_ref(vmg0_)->get_targobj(vmg_ retval);

    /* handled */
    return TRUE;
}